

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *
cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Script *multisig_script,uint32_t *require_num)

{
  bool bVar1;
  ScriptOperator *pSVar2;
  CfdException *pCVar3;
  int64_t iVar4;
  iterator __first;
  iterator __last;
  allocator local_509;
  string local_508;
  string local_4e8;
  CfdSourceLocation local_4c8;
  ScriptElement local_4b0;
  ScriptType local_44c;
  undefined1 local_448 [8];
  ScriptElement require_num_element;
  Pubkey local_3d0;
  undefined1 local_3b2;
  allocator local_3b1;
  string local_3b0;
  string local_390;
  ScriptElementType local_36c;
  CfdSourceLocation local_368;
  ScriptElement local_350;
  ScriptElement *local_2f0;
  ScriptElement *pubkey_element;
  string local_2e0;
  string local_2c0;
  CfdSourceLocation local_2a0;
  long local_288;
  int64_t i;
  int64_t contain_pubkey_num;
  string local_270;
  string local_250;
  CfdSourceLocation local_230;
  ScriptElement local_218;
  ScriptElement *local_1b8;
  ScriptElement *op_m;
  string local_1a8;
  string local_188;
  CfdSourceLocation local_168;
  int local_14c;
  undefined1 local_148 [8];
  ScriptElement element;
  string local_e0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_c0;
  undefined1 local_a8 [8];
  IteratorWrapper<cfd::core::ScriptElement> itr;
  undefined1 local_40 [8];
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elements;
  uint32_t *require_num_local;
  Script *multisig_script_local;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys;
  
  elements.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (__return_storage_ptr__);
  Script::GetElementList
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)local_40
             ,multisig_script);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_c0,
             (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)local_40
            );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_e0,"Invalid script element access",
             (allocator *)((long)&element.value_ + 7));
  IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper
            ((IteratorWrapper<cfd::core::ScriptElement> *)local_a8,&local_c0,&local_e0,true);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&element.value_ + 7));
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_c0);
  do {
    bVar1 = IteratorWrapper<cfd::core::ScriptElement>::hasNext
                      ((IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
    if (!bVar1) break;
    IteratorWrapper<cfd::core::ScriptElement>::next
              ((ScriptElement *)local_148,(IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
    bVar1 = ScriptElement::IsOpCode((ScriptElement *)local_148);
    if (bVar1) {
      pSVar2 = ScriptElement::GetOpCode((ScriptElement *)local_148);
      bVar1 = ScriptOperator::operator==(pSVar2,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG);
      if (!bVar1) {
        pSVar2 = ScriptElement::GetOpCode((ScriptElement *)local_148);
        bVar1 = ScriptOperator::operator==
                          (pSVar2,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIGVERIFY);
        if (!bVar1) {
          local_14c = 0;
          goto LAB_00521b8a;
        }
      }
      local_14c = 3;
    }
    else {
      local_14c = 2;
    }
LAB_00521b8a:
    ScriptElement::~ScriptElement((ScriptElement *)local_148);
  } while ((local_14c == 0) || (local_14c == 2));
  bVar1 = IteratorWrapper<cfd::core::ScriptElement>::hasNext
                    ((IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
  if (!bVar1) {
    local_168.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_168.filename = local_168.filename + 1;
    local_168.line = 0x628;
    local_168.funcname = "ExtractPubkeysFromMultisigScript";
    Script::ToString_abi_cxx11_(&local_188,multisig_script);
    logger::warn<std::__cxx11::string>
              (&local_168,
               "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found in redeem script: script={}",
               &local_188);
    ::std::__cxx11::string::~string((string *)&local_188);
    op_m._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_1a8,
               "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found in redeem script.",
               (allocator *)((long)&op_m + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_1a8);
    op_m._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  IteratorWrapper<cfd::core::ScriptElement>::next
            (&local_218,(IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
  local_1b8 = &local_218;
  bVar1 = ScriptElement::IsNumber(local_1b8);
  if (bVar1) {
    i = ScriptElement::GetNumber(local_1b8);
    local_288 = 0;
    while( true ) {
      if (i <= local_288) {
        local_44c = kOpInvalidOpCode;
        ScriptElement::ScriptElement((ScriptElement *)local_448,&local_44c);
        bVar1 = IteratorWrapper<cfd::core::ScriptElement>::hasNext
                          ((IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
        if (bVar1) {
          IteratorWrapper<cfd::core::ScriptElement>::next
                    (&local_4b0,(IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
          ScriptElement::operator=((ScriptElement *)local_448,&local_4b0);
          ScriptElement::~ScriptElement(&local_4b0);
        }
        bVar1 = ScriptElement::IsNumber((ScriptElement *)local_448);
        if (((bVar1) && (bVar1 = ScriptElement::IsOpCode((ScriptElement *)local_448), bVar1)) &&
           (iVar4 = ScriptElement::GetNumber((ScriptElement *)local_448), 0 < iVar4)) {
          if (require_num != (uint32_t *)0x0) {
            iVar4 = ScriptElement::GetNumber((ScriptElement *)local_448);
            *require_num = (uint32_t)iVar4;
          }
          __first = ::std::begin<std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>
                              (__return_storage_ptr__);
          __last = ::std::end<std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>
                             (__return_storage_ptr__);
          ::std::
          reverse<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>>
                    ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                      )__first._M_current,
                     (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                      )__last._M_current);
          elements.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          local_14c = 1;
          ScriptElement::~ScriptElement((ScriptElement *)local_448);
          ScriptElement::~ScriptElement(&local_218);
          IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper
                    ((IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
          ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
          ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                  local_40);
          if ((elements.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
            ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                      (__return_storage_ptr__);
          }
          return __return_storage_ptr__;
        }
        local_4c8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
                     ,0x2f);
        local_4c8.filename = local_4c8.filename + 1;
        local_4c8.line = 0x667;
        local_4c8.funcname = "ExtractPubkeysFromMultisigScript";
        Script::ToString_abi_cxx11_(&local_4e8,multisig_script);
        logger::warn<std::__cxx11::string>
                  (&local_4c8,
                   "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing require signature number.: script={}"
                   ,&local_4e8);
        ::std::__cxx11::string::~string((string *)&local_4e8);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_508,
                   "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing require signature number."
                   ,&local_509);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_508);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar1 = IteratorWrapper<cfd::core::ScriptElement>::hasNext
                        ((IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
      if (!bVar1) {
        local_2a0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
                     ,0x2f);
        local_2a0.filename = local_2a0.filename + 1;
        local_2a0.line = 0x645;
        local_2a0.funcname = "ExtractPubkeysFromMultisigScript";
        Script::ToString_abi_cxx11_(&local_2c0,multisig_script);
        logger::warn<long&,std::__cxx11::string>
                  (&local_2a0,
                   "Not found enough pubkeys in redeem script.: require_pubkey_num={}, script={}",&i
                   ,&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_2c0);
        pubkey_element._6_1_ = 1;
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_2e0,"Not found enough pubkeys in redeem script.",
                   (allocator *)((long)&pubkey_element + 7));
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_2e0);
        pubkey_element._6_1_ = 0;
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next
                (&local_350,(IteratorWrapper<cfd::core::ScriptElement> *)local_a8);
      local_2f0 = &local_350;
      bVar1 = ScriptElement::IsBinary(local_2f0);
      if (!bVar1) break;
      ScriptElement::GetBinaryData((ByteData *)&require_num_element.value_,local_2f0);
      Pubkey::Pubkey(&local_3d0,(ByteData *)&require_num_element.value_);
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
                (__return_storage_ptr__,&local_3d0);
      Pubkey::~Pubkey(&local_3d0);
      ByteData::~ByteData((ByteData *)&require_num_element.value_);
      ScriptElement::~ScriptElement(&local_350);
      local_288 = local_288 + 1;
    }
    local_368.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_368.filename = local_368.filename + 1;
    local_368.line = 0x652;
    local_368.funcname = "ExtractPubkeysFromMultisigScript";
    local_36c = ScriptElement::GetType(local_2f0);
    ScriptElement::ToString_abi_cxx11_(&local_390,local_2f0);
    logger::warn<cfd::core::ScriptElementType,std::__cxx11::string>
              (&local_368,
               "Invalid script element. Not binary element.: ScriptElementType={}, data={}",
               &local_36c,&local_390);
    ::std::__cxx11::string::~string((string *)&local_390);
    local_3b2 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_3b0,"Invalid ScriptElementType.(not binary)",&local_3b1);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_3b0);
    local_3b2 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_230.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
               ,0x2f);
  local_230.filename = local_230.filename + 1;
  local_230.line = 0x636;
  local_230.funcname = "ExtractPubkeysFromMultisigScript";
  Script::ToString_abi_cxx11_(&local_250,multisig_script);
  logger::warn<std::__cxx11::string>
            (&local_230,
             "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing contain pubkey number.: script={}"
             ,&local_250);
  ::std::__cxx11::string::~string((string *)&local_250);
  contain_pubkey_num._6_1_ = 1;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_270,
             "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing contain pubkey number."
             ,(allocator *)((long)&contain_pubkey_num + 7));
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_270);
  contain_pubkey_num._6_1_ = 0;
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<Pubkey> ScriptUtil::ExtractPubkeysFromMultisigScript(
    const Script& multisig_script, uint32_t* require_num) {
  std::vector<Pubkey> pubkeys;
  const std::vector<ScriptElement> elements = multisig_script.GetElementList();

  // find OP_CHECKMULTISIG or OP_CHECKMULTISIGVERIFY
  IteratorWrapper<ScriptElement> itr = IteratorWrapper<ScriptElement>(
      elements, "Invalid script element access", true);
  // search OP_CHECKMULTISIG(or VERIFY)
  while (itr.hasNext()) {
    ScriptElement element = itr.next();
    if (!element.IsOpCode()) {
      continue;
    }
    if (element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIG ||
        element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIGVERIFY) {
      break;
    }
  }
  // target opcode not found
  if (!itr.hasNext()) {
    warn(
        CFD_LOG_SOURCE,
        "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found"
        " in redeem script: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found"
        " in redeem script.");
  }

  // get contain pubkey num
  const ScriptElement& op_m = itr.next();
  if (!op_m.IsNumber()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing contain pubkey number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing contain pubkey number.");
  }

  // set pubkey to vector(reverse data)
  int64_t contain_pubkey_num = op_m.GetNumber();
  for (int64_t i = 0; i < contain_pubkey_num; ++i) {
    if (!itr.hasNext()) {
      warn(
          CFD_LOG_SOURCE,
          "Not found enough pubkeys in redeem script.: "
          "require_pubkey_num={}, script={}",
          contain_pubkey_num, multisig_script.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Not found enough pubkeys in redeem script.");
    }

    const ScriptElement& pubkey_element = itr.next();
    // check script element type
    if (!pubkey_element.IsBinary()) {
      warn(
          CFD_LOG_SOURCE,
          "Invalid script element. Not binary element.: "
          "ScriptElementType={}, data={}",
          pubkey_element.GetType(), pubkey_element.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid ScriptElementType.(not binary)");
    }

    // push pubkey data
    pubkeys.push_back(Pubkey(pubkey_element.GetBinaryData()));
  }

  // check opcode(require signature num)
  ScriptElement require_num_element(ScriptType::kOpInvalidOpCode);
  if (itr.hasNext()) {
    require_num_element = itr.next();
  }
  if (!(require_num_element.IsNumber() && require_num_element.IsOpCode()) ||
      (require_num_element.GetNumber() <= 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing require signature number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing require signature number.");
  }

  if (require_num) {
    *require_num = static_cast<uint32_t>(require_num_element.GetNumber());
  }
  // return reverse pubkey vector
  std::reverse(std::begin(pubkeys), std::end(pubkeys));
  return pubkeys;
}